

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.h
# Opt level: O0

bool mdns::query(int fd,sockaddr_in *address)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  time_t tVar4;
  int *piVar5;
  void *__buf;
  size_t __n;
  ostream *poVar6;
  ulong uVar7;
  char *pcVar8;
  undefined1 local_1c0 [8];
  string name;
  long size;
  int local_190;
  int key;
  int i;
  int st;
  timeval tv;
  fd_set *__arr;
  undefined1 auStack_168 [4];
  uint __i;
  fd_set fds;
  long lStack_e0;
  int pingTries;
  time_t endTime;
  undefined1 local_d0 [4];
  socklen_t addressSize;
  sockaddr_storage addressStorage;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string packet;
  sockaddr_in *address_local;
  int fd_local;
  
  packet.field_2._8_8_ = address;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,0x200,'\0',&local_39);
  std::allocator<char>::~allocator(&local_39);
  endTime._4_4_ = 0x80;
  tVar4 = time((time_t *)0x0);
  lStack_e0 = tVar4 + 10;
  fds.fds_bits[0xf]._4_4_ = 0;
  do {
    tVar4 = time((time_t *)0x0);
    if (lStack_e0 < tVar4) {
      if ((s_verbose & 1U) != 0) {
        printf("\x1b[2K\r - Timeout waiting for mdns response, sending a new\n");
      }
      sendRequest(fd);
      tVar4 = time((time_t *)0x0);
      lStack_e0 = tVar4 + 10;
      fds.fds_bits[0xf]._4_4_ = fds.fds_bits[0xf]._4_4_ + 1;
    }
    else {
      tv.tv_usec = (__suseconds_t)auStack_168;
      for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
        *(undefined8 *)(tv.tv_usec + (ulong)__arr._4_4_ * 8) = 0;
      }
      iVar2 = fd;
      if (fd < 0) {
        iVar2 = fd + 0x3f;
      }
      *(ulong *)(auStack_168 + (long)(iVar2 >> 6) * 8) =
           *(ulong *)(auStack_168 + (long)(iVar2 >> 6) * 8) | 1L << ((ulong)(byte)fd & 0x3f);
      auStack_168[0] = auStack_168[0] | 1;
      tv.tv_sec = 0;
      _i = 1;
      iVar2 = select(fd + 1,(fd_set *)auStack_168,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&i);
      piVar5 = __errno_location();
      if (*piVar5 != 4) {
        if (iVar2 == 0) {
          query::spinnerPos = query::spinnerPos + 1 & 7;
          printf("%c Waiting for response",(ulong)(uint)(int)"-\\|/-\\|/"[query::spinnerPos]);
          for (local_190 = 0; local_190 < fds.fds_bits[0xf]._4_4_ % 10; local_190 = local_190 + 1) {
            printf(".");
          }
          fflush(_stdout);
          printf("\x1b[2K\r");
        }
        else if (iVar2 < 0) {
          piVar5 = __errno_location();
          if (*piVar5 != 4) {
            perror(" ! Error while waiting to read");
          }
        }
        else {
          if ((auStack_168[0] & 1) != 0) {
            uVar3 = getchar();
            if ((uVar3 == 0x1b) || (uVar3 == 0x71)) {
              puts("Aborted");
              address_local._7_1_ = 0;
              goto LAB_00108dea;
            }
            if ((s_verbose & 1U) != 0) {
              printf("Unhandled key 0x%x\n",(ulong)uVar3);
            }
          }
          if ((*(ulong *)(auStack_168 + (long)(fd / 0x40) * 8) &
              1L << ((byte)((long)fd % 0x40) & 0x3f)) != 0) {
            __buf = (void *)std::__cxx11::string::data();
            __n = std::__cxx11::string::size();
            name.field_2._8_8_ =
                 recvfrom(fd,__buf,__n,0,(sockaddr *)local_d0,(socklen_t *)((long)&endTime + 4));
            if ((long)name.field_2._8_8_ < 0) {
              perror(" ! Failed to read packet");
              address_local._7_1_ = 0;
              goto LAB_00108dea;
            }
            if (local_d0._0_2_ == 2) {
              memcpy((void *)packet.field_2._8_8_,local_d0,(ulong)endTime._4_4_);
              if ((s_verbose & 1U) != 0) {
                puts(" < Got response");
              }
              std::__cxx11::string::resize((ulong)local_38);
              parsePacket((string *)local_1c0,(string *)local_38);
              uVar7 = std::__cxx11::string::empty();
              if ((uVar7 & 1) == 0) {
                bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_1c0,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)queryName_abi_cxx11_);
                if (bVar1) {
                  if ((s_verbose & 1U) != 0) {
                    poVar6 = std::operator<<((ostream *)&std::cerr," - Got wrong name \'");
                    poVar6 = std::operator<<(poVar6,(string *)local_1c0);
                    poVar6 = std::operator<<(poVar6,"\' from ");
                    pcVar8 = inet_ntoa((in_addr)*(in_addr_t *)(packet.field_2._8_8_ + 4));
                    poVar6 = std::operator<<(poVar6,pcVar8);
                    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                  }
                  size._0_4_ = 3;
                }
                else {
                  address_local._7_1_ = 1;
                  size._0_4_ = 1;
                }
              }
              else {
                size._0_4_ = 3;
              }
              std::__cxx11::string::~string((string *)local_1c0);
              if ((int)size != 3) goto LAB_00108dea;
            }
            else {
              poVar6 = std::operator<<((ostream *)&std::cerr," ! Got wrong family, not IPv4 ");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_d0._0_2_);
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            }
          }
        }
      }
    }
    if ((s_running & 1U) == 0) {
      address_local._7_1_ = 0;
LAB_00108dea:
      std::__cxx11::string::~string((string *)local_38);
      return (bool)(address_local._7_1_ & 1);
    }
  } while( true );
}

Assistant:

bool query(const int fd, sockaddr_in *address)
{
    // TODO: continously loop and update when new devices appear

    std::string packet(512, '\0');

    sockaddr_storage addressStorage;
    socklen_t addressSize = sizeof(addressStorage);

    time_t endTime = time(nullptr) + 10;
    int pingTries = 0;

    do {
        if (time(nullptr) > endTime) {
            if (s_verbose) printf("\033[2K\r - Timeout waiting for mdns response, sending a new\n");
            sendRequest(fd);
            endTime = time(nullptr) + 10;
            pingTries++;
            continue;
        }

        fd_set fds;
        FD_ZERO(&fds);
        FD_SET(fd, &fds);
        FD_SET(STDIN_FILENO, &fds);

        timeval tv = {0, 0};
        //tv.tv_usec = 100000; // 100ms, need dat nice spinner
        tv.tv_sec = 1;

        int st = select(fd+1, &fds, nullptr, nullptr, &tv);
        if (errno == EINTR) {
            continue;
        }
        if (st == 0) {
            static const char spinner[] = { '-', '\\', '|', '/', '-', '\\', '|', '/', };
            static uint8_t spinnerPos = 0;
            spinnerPos = (spinnerPos + 1) % sizeof(spinner);
            printf("%c Waiting for response", spinner[spinnerPos]);
            for (int i=0; i<pingTries % 10; i++) printf(".");
            fflush(stdout);
            printf("\033[2K\r"); // Erase the line, which won't be visible until the next flush
            continue;
        }
        if (st < 0) {
            if (errno != EINTR) {
                perror(" ! Error while waiting to read");
            }
            continue;
        }

        if (FD_ISSET(STDIN_FILENO, &fds)) {
            const int key = getchar();
            switch(key) {
            case 'q':
            case '\x1b':
                puts("Aborted");
                return false;
            default:
                if (s_verbose) printf("Unhandled key 0x%x\n", key);
                break;
            }
        }
        if (!FD_ISSET(fd, &fds)) {
            continue;
        }

        long size = recvfrom(
                fd,
                packet.data(),
                packet.size(),
                0,
                reinterpret_cast<sockaddr*>(&addressStorage),
                &addressSize
            );

        if (size < 0) {
            perror(" ! Failed to read packet");
            return false;
        }

        if (addressStorage.ss_family != AF_INET) {
            std::cerr << " ! Got wrong family, not IPv4 " << addressStorage.ss_family << std::endl;
            continue;
        }

        memcpy(address, &addressStorage, addressSize);
        if (s_verbose) {
            puts(" < Got response");
        }

        packet.resize(size);

        std::string name = parsePacket(packet);
        if (name.empty()) {
            continue;
        }
        if (name != queryName) {
            if (s_verbose) {
                std::cerr << " - Got wrong name '" << name << "' from " << inet_ntoa(address->sin_addr) << std::endl;
            }
            continue;
        }

        return true;
    } while (s_running);

    return false;
}